

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

bool __thiscall idx2::free_list_allocator::Alloc(free_list_allocator *this,buffer *Buf,i64 Bytes)

{
  node *pnVar1;
  undefined1 uVar2;
  int iVar3;
  
  if ((this->MaxBytes < Bytes || Bytes < this->MinBytes) ||
     (pnVar1 = this->Head, pnVar1 == (node *)0x0)) {
    iVar3 = (**this->Parent->_vptr_allocator)(this->Parent,Buf);
    uVar2 = (undefined1)iVar3;
    Buf->Bytes = Bytes;
    Buf->Alloc = &this->super_allocator;
  }
  else {
    Buf->Data = (byte *)pnVar1;
    Buf->Bytes = Bytes;
    Buf->Alloc = &this->super_allocator;
    this->Head = pnVar1->Next;
    uVar2 = 1;
  }
  return (bool)uVar2;
}

Assistant:

bool
free_list_allocator::Alloc(buffer* Buf, i64 Bytes)
{
  idx2_Assert(Parent);
  if (MinBytes <= Bytes && Bytes <= MaxBytes && Head)
  {
    Buf->Data = (byte*)Head;
    Buf->Bytes = Bytes;
    Buf->Alloc = this;
    Head = Head->Next;
    return true;
  }
  bool Result = Parent->Alloc(Buf, MaxBytes);
  Buf->Bytes = Bytes;
  Buf->Alloc = this;
  return Result;
}